

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_x86_64-inl.h
# Opt level: O3

int google::GetStackTrace(void **result,int max_depth,int skip_count)

{
  void **local_28;
  trace_arg_t targ;
  
  targ.max_depth = 0;
  if (ready_to_run == '\x01') {
    targ.result._4_4_ = skip_count + 1;
    targ.max_depth = 0;
    local_28 = result;
    targ.result._0_4_ = max_depth;
    _Unwind_Backtrace(GetOneFrame,&local_28);
  }
  return targ.max_depth;
}

Assistant:

int GetStackTrace(void** result, int max_depth, int skip_count) {
  if (!ready_to_run)
    return 0;

  trace_arg_t targ;

  skip_count += 1;         // Do not include the "GetStackTrace" frame

  targ.result = result;
  targ.max_depth = max_depth;
  targ.skip_count = skip_count;
  targ.count = 0;

  _Unwind_Backtrace(GetOneFrame, &targ);

  return targ.count;
}